

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aVaryingInterpolationTests.cpp
# Opt level: O0

bool deqp::gles2::Accuracy::isValidFloat(Precision precision,float val)

{
  bool bVar1;
  byte local_1e;
  byte local_1d;
  Float<unsigned_int,_8,_23,_127,_3U> local_1c;
  Float<unsigned_short,_5,_10,_15,_3U> local_16;
  Float32 fp32;
  Float16 fp16;
  float val_local;
  Precision precision_local;
  
  fp32.m_value = (StorageType)val;
  if (precision == PRECISION_MEDIUMP) {
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_16,val);
    bVar1 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::isDenorm(&local_16);
    local_1d = 0;
    local_1e = local_1d;
    if (!bVar1) {
      bVar1 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::isInf(&local_16);
      local_1d = 0;
      local_1e = local_1d;
      if (!bVar1) {
        bVar1 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::isNaN(&local_16);
        local_1e = bVar1 ^ 0xff;
      }
    }
  }
  else {
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_1c,val);
    bVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::isDenorm(&local_1c);
    local_1e = 0;
    if (!bVar1) {
      bVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::isInf(&local_1c);
      local_1e = 0;
      if (!bVar1) {
        bVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::isNaN(&local_1c);
        local_1e = bVar1 ^ 0xff;
      }
    }
  }
  val_local._3_1_ = (bool)(local_1e & 1);
  return val_local._3_1_;
}

Assistant:

static bool isValidFloat (glu::Precision precision, float val)
{
	if (precision == glu::PRECISION_MEDIUMP)
	{
		tcu::Float16 fp16(val);
		return !fp16.isDenorm() && !fp16.isInf() && !fp16.isNaN();
	}
	else
	{
		tcu::Float32 fp32(val);
		return !fp32.isDenorm() && !fp32.isInf() && !fp32.isNaN();
	}
}